

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void dump_regressor(vw *all,string *reg_name,bool as_text)

{
  __type_conflict _Var1;
  int iVar2;
  ostream *poVar3;
  vw_exception *this;
  string start_name;
  string local_278;
  io_buf io_temp;
  stringstream __msg;
  ostream local_1a0;
  
  std::__cxx11::string::string((string *)&__msg,"",(allocator *)&io_temp);
  _Var1 = std::operator==(reg_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if (!_Var1) {
    std::__cxx11::string::string((string *)&__msg,".writing",(allocator *)&io_temp);
    std::operator+(&start_name,reg_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    io_buf::io_buf(&io_temp);
    io_buf::open_file(&io_temp,start_name._M_dataplus._M_p,all->stdin_off,2);
    dump_regressor(all,&io_temp,as_text);
    remove((reg_name->_M_dataplus)._M_p);
    iVar2 = rename(start_name._M_dataplus._M_p,(reg_name->_M_dataplus)._M_p);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar3 = std::operator<<(&local_1a0,
                               "WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
                              );
      poVar3 = std::operator<<(poVar3,start_name._M_dataplus._M_p);
      poVar3 = std::operator<<(poVar3," to ");
      std::operator<<(poVar3,(reg_name->_M_dataplus)._M_p);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x237,&local_278);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    io_buf::~io_buf(&io_temp);
    std::__cxx11::string::~string((string *)&start_name);
  }
  return;
}

Assistant:

void dump_regressor(vw& all, string reg_name, bool as_text)
{
  if (reg_name == string(""))
    return;
  string start_name = reg_name + string(".writing");
  io_buf io_temp;

  io_temp.open_file(start_name.c_str(), all.stdin_off, io_buf::WRITE);

  dump_regressor(all, io_temp, as_text);

  remove(reg_name.c_str());

  if (0 != rename(start_name.c_str(), reg_name.c_str()))
    THROW("WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
        << start_name.c_str() << " to " << reg_name.c_str());
}